

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_stage6_high48_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  
  alVar1 = x[0x10];
  alVar2 = x[0x11];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x13]);
  x[0x10] = alVar3;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x13]);
  x[0x13] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])x[0x12]);
  x[0x11] = alVar1;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])x[0x12]);
  x[0x12] = alVar1;
  alVar1 = x[0x14];
  alVar2 = (__m128i)psubsw((undefined1  [16])x[0x17],(undefined1  [16])alVar1);
  x[0x14] = alVar2;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0x17],(undefined1  [16])alVar1);
  x[0x17] = alVar1;
  alVar1 = x[0x15];
  alVar2 = (__m128i)psubsw((undefined1  [16])x[0x16],(undefined1  [16])alVar1);
  x[0x15] = alVar2;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0x16],(undefined1  [16])alVar1);
  x[0x16] = alVar1;
  alVar1 = x[0x18];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x1b]);
  x[0x18] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x1b]);
  x[0x1b] = alVar1;
  alVar1 = x[0x19];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x1a]);
  x[0x19] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x1a]);
  x[0x1a] = alVar1;
  alVar1 = x[0x1c];
  alVar2 = (__m128i)psubsw((undefined1  [16])x[0x1f],(undefined1  [16])alVar1);
  x[0x1c] = alVar2;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0x1f],(undefined1  [16])alVar1);
  x[0x1f] = alVar1;
  alVar1 = x[0x1d];
  alVar2 = (__m128i)psubsw((undefined1  [16])x[0x1e],(undefined1  [16])alVar1);
  x[0x1d] = alVar2;
  alVar1 = (__m128i)paddsw((undefined1  [16])x[0x1e],(undefined1  [16])alVar1);
  x[0x1e] = alVar1;
  idct64_stage6_high32_sse2(x,cospi,__rounding,cos_bit);
  return;
}

Assistant:

static inline void idct64_stage6_high48_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  btf_16_adds_subs_sse2(x[16], x[19]);
  btf_16_adds_subs_sse2(x[17], x[18]);
  btf_16_subs_adds_sse2(x[23], x[20]);
  btf_16_subs_adds_sse2(x[22], x[21]);
  btf_16_adds_subs_sse2(x[24], x[27]);
  btf_16_adds_subs_sse2(x[25], x[26]);
  btf_16_subs_adds_sse2(x[31], x[28]);
  btf_16_subs_adds_sse2(x[30], x[29]);
  idct64_stage6_high32_sse2(x, cospi, __rounding, cos_bit);
}